

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O0

Vec_Int_t * Sdb_StoIterCuts(Sdb_Sto_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int RetValue_1;
  int RetValue;
  int iSigned;
  int iNewBack;
  int iNewFront;
  int iNew;
  int Limit;
  int *pCut;
  int iObj;
  int k;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRes;
  Vec_Int_t *vAll;
  Vec_Int_t *v5Cut;
  Vec_Wec_t *v5Cuts;
  Sdb_Sto_t *p_local;
  
  v5Cuts = (Vec_Wec_t *)p;
  v5Cut = (Vec_Int_t *)Vec_WecAlloc(100);
  iSigned = -1;
  RetValue = -1;
  RetValue_1 = 0;
  pCut._0_4_ = 0;
  do {
    bVar5 = false;
    if ((int)pCut < *(int *)&v5Cuts[1].pArray[1].pArray) {
      _iObj = Gia_ManObj((Gia_Man_t *)v5Cuts[1].pArray,(int)pCut);
      bVar5 = _iObj != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) {
      iVar2 = Vec_WecSize((Vec_Wec_t *)v5Cut);
      Vec_WecSize((Vec_Wec_t *)v5Cut);
      printf("Detected %d  5-cuts.\n");
      vRes = Sdb_StoFindAll((Vec_Wec_t *)v5Cut);
      pCut._0_4_ = 0;
      while( true ) {
        bVar5 = false;
        if ((int)pCut < *(int *)&v5Cuts[1].pArray[1].pArray) {
          _iObj = Gia_ManObj((Gia_Man_t *)v5Cuts[1].pArray,(int)pCut);
          bVar5 = _iObj != (Gia_Obj_t *)0x0;
        }
        if (!bVar5) break;
        iVar3 = Gia_ObjIsAnd(_iObj);
        if ((iVar3 != 0) &&
           (iVar3 = Sdb_StoIterCutsOne((Sdb_Sto_t *)v5Cuts,(int)pCut,4,(int **)&iNew), iVar3 != 0))
        {
          if ((iVar3 < 2) || (4 < iVar3)) {
            __assert_fail("RetValue >= 2 && RetValue <= 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                          ,0x42d,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
          }
          if (*_iNew != 4) {
            __assert_fail("pCut[0] == 4",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                          ,0x42e,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
          }
          iVar4 = Sdb_StoDiffExactlyOne((Vec_Wec_t *)v5Cut,iVar2,_iNew);
          if (iVar4 != -1) {
            iVar1 = iVar4;
            if (iVar3 == 2) {
              iVar1 = RetValue;
              iSigned = iVar4;
            }
            RetValue = iVar1;
            if (iVar3 == 4) {
              RetValue_1 = 1;
            }
            vAll = Vec_WecPushLevel((Vec_Wec_t *)v5Cut);
            Vec_IntPush(vAll,0);
            for (pCut._4_4_ = 1; pCut._4_4_ <= *_iNew; pCut._4_4_ = pCut._4_4_ + 1) {
              Vec_IntPush(vAll,_iNew[pCut._4_4_]);
            }
          }
        }
        pCut._0_4_ = (int)pCut + 1;
      }
      Vec_IntFree(vRes);
      Vec_WecPrint((Vec_Wec_t *)v5Cut,0);
      if (iSigned != 0) {
        printf("Front  = %d\n",(ulong)(uint)iSigned);
      }
      if (RetValue != 0) {
        printf("Back   = %d\n",(ulong)(uint)RetValue);
      }
      if (RetValue_1 != 0) {
        printf("Sign   = %d\n",(ulong)(uint)RetValue_1);
      }
      pObj = (Gia_Obj_t *)Sdb_StoFindInputs((Vec_Wec_t *)v5Cut,iSigned);
      Vec_WecFree((Vec_Wec_t *)v5Cut);
      return (Vec_Int_t *)pObj;
    }
    iVar2 = Gia_ObjIsAnd(_iObj);
    if ((iVar2 != 0) &&
       (iVar2 = Sdb_StoIterCutsOne((Sdb_Sto_t *)v5Cuts,(int)pCut,5,(int **)&iNew), iVar2 != 0)) {
      if (iVar2 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                      ,0x41f,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
      }
      if (*_iNew != 5) {
        __assert_fail("pCut[0] == 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acec2Mult.c"
                      ,0x420,"Vec_Int_t *Sdb_StoIterCuts(Sdb_Sto_t *)");
      }
      vAll = Vec_WecPushLevel((Vec_Wec_t *)v5Cut);
      for (pCut._4_4_ = 1; pCut._4_4_ <= *_iNew; pCut._4_4_ = pCut._4_4_ + 1) {
        Vec_IntPush(vAll,_iNew[pCut._4_4_]);
      }
    }
    pCut._0_4_ = (int)pCut + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Sdb_StoIterCuts( Sdb_Sto_t * p )
{
    Vec_Wec_t * v5Cuts = Vec_WecAlloc( 100 );
    Vec_Int_t * v5Cut, * vAll, * vRes;
    Gia_Obj_t * pObj;   
    int k, iObj, * pCut, Limit, iNew, iNewFront = -1, iNewBack = -1, iSigned = 0;
    Gia_ManForEachAnd( p->pGia, pObj, iObj )
    {
        int RetValue = Sdb_StoIterCutsOne( p, iObj, 5, &pCut );
        if ( RetValue == 0 )
            continue;
        assert( RetValue == 1 );
        assert( pCut[0] == 5 );
        v5Cut = Vec_WecPushLevel( v5Cuts );
        for ( k = 1; k <= pCut[0]; k++ )
            Vec_IntPush( v5Cut, pCut[k] );
    }
    Limit = Vec_WecSize( v5Cuts );
    printf( "Detected %d  5-cuts.\n", Vec_WecSize(v5Cuts) );
    vAll = Sdb_StoFindAll( v5Cuts );
    Gia_ManForEachAnd( p->pGia, pObj, iObj )
    {
        int RetValue = Sdb_StoIterCutsOne( p, iObj, 4, &pCut );
        if ( RetValue == 0 )
            continue;
        assert( RetValue >= 2 && RetValue <= 4 );
        assert( pCut[0] == 4 );
        // find cut, which differs in exactly one input
        iNew = Sdb_StoDiffExactlyOne( v5Cuts, Limit, pCut );
        if ( iNew == -1 )
            continue;
        if ( RetValue == 2 )
            iNewFront = iNew;
        else 
            iNewBack = iNew;
        if ( RetValue == 4 )
            iSigned = 1;
        // save in the second cut
        v5Cut = Vec_WecPushLevel( v5Cuts );
        Vec_IntPush( v5Cut, 0 );
        for ( k = 1; k <= pCut[0]; k++ )
            Vec_IntPush( v5Cut, pCut[k] );
    }
    Vec_IntFree( vAll );
    Vec_WecPrint( v5Cuts, 0 );

    if ( iNewFront )
        printf( "Front  = %d\n", iNewFront );
    if ( iNewBack )
        printf( "Back   = %d\n", iNewBack );
    if ( iSigned )
        printf( "Sign   = %d\n", iSigned );

    vRes = Sdb_StoFindInputs( v5Cuts, iNewFront );

    Vec_WecFree( v5Cuts );
    return vRes;
}